

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O0

void libyuv::ScalePlaneBox
               (int src_width,int src_height,int dst_width,int dst_height,int src_stride,
               int dst_stride,uint8_t *src_ptr,uint8_t *dst_ptr)

{
  int iVar1;
  void *__ptr;
  void *__s;
  long lVar2;
  int in_ECX;
  undefined4 in_EDX;
  int in_ESI;
  int in_EDI;
  int in_R8D;
  int in_R9D;
  long in_stack_00000008;
  long in_stack_00000010;
  uint8_t *src;
  int iy;
  int boxheight;
  _func_void_uint8_t_ptr_uint16_t_ptr_int *ScaleAddRow;
  _func_void_int_int_int_int_uint16_t_ptr_uint8_t_ptr *ScaleAddCols;
  uint8_t *row16;
  uint8_t *row16_mem;
  int max_y;
  int dy;
  int dx;
  int y;
  int x;
  int k;
  int j;
  int test_flag;
  int local_7c;
  int *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  code *pcVar3;
  undefined8 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  code *local_58;
  int *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffb8;
  int *in_stack_ffffffffffffffc0;
  uint local_2c;
  int local_28;
  undefined4 local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  undefined4 local_c;
  uint local_4;
  
  local_24 = 0;
  local_28 = 0;
  local_2c = 0;
  local_18 = in_R9D;
  local_14 = in_R8D;
  local_10 = in_ECX;
  local_c = in_EDX;
  local_4 = in_EDI;
  ScaleSlope(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
             (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98,
             (FilterMode)((ulong)in_stack_ffffffffffffff90 >> 0x20),in_stack_ffffffffffffff88,
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0);
  local_4 = Abs(local_4);
  __ptr = malloc((long)(int)(local_4 * 2 + 0x3f));
  __s = (void *)((long)__ptr + 0x3fU & 0xffffffffffffffc0);
  if ((local_2c & 0xffff) == 0) {
    if (local_2c == 0x10000) {
      pcVar3 = ScaleAddCols0_C;
    }
    else {
      pcVar3 = ScaleAddCols1_C;
    }
  }
  else {
    pcVar3 = ScaleAddCols2_C;
  }
  local_58 = ScaleAddRow_C;
  test_flag = (int)((ulong)&local_2c >> 0x20);
  iVar1 = TestCpuFlag(test_flag);
  if ((iVar1 != 0) && (local_58 = ScaleAddRow_Any_SSE2, (local_4 & 0xf) == 0)) {
    local_58 = ScaleAddRow_SSE2;
  }
  iVar1 = TestCpuFlag(test_flag);
  if ((iVar1 != 0) && (local_58 = ScaleAddRow_Any_AVX2, (local_4 & 0x1f) == 0)) {
    local_58 = ScaleAddRow_AVX2;
  }
  for (local_1c = 0; local_1c < local_10; local_1c = local_1c + 1) {
    local_7c = local_28 >> 0x10;
    lVar2 = in_stack_00000008 + local_7c * local_14;
    if (in_ESI << 0x10 < local_28) {
      local_28 = in_ESI << 0x10;
    }
    if ((local_28 >> 0x10) - local_7c < 1) {
      local_7c = 1;
    }
    else {
      local_7c = (local_28 >> 0x10) - local_7c;
    }
    memset(__s,0,(long)(int)(local_4 << 1));
    for (local_20 = 0; local_20 < local_7c; local_20 = local_20 + 1) {
      (*local_58)(lVar2,__s,local_4);
      lVar2 = lVar2 + local_14;
    }
    (*pcVar3)(local_c,local_7c,local_24,local_2c,__s,in_stack_00000010);
    in_stack_00000010 = in_stack_00000010 + local_18;
  }
  free(__ptr);
  return;
}

Assistant:

static void ScalePlaneBox(int src_width,
                          int src_height,
                          int dst_width,
                          int dst_height,
                          int src_stride,
                          int dst_stride,
                          const uint8_t* src_ptr,
                          uint8_t* dst_ptr) {
  int j, k;
  // Initial source x/y coordinate and step values as 16.16 fixed point.
  int x = 0;
  int y = 0;
  int dx = 0;
  int dy = 0;
  const int max_y = (src_height << 16);
  ScaleSlope(src_width, src_height, dst_width, dst_height, kFilterBox, &x, &y,
             &dx, &dy);
  src_width = Abs(src_width);
  {
    // Allocate a row buffer of uint16_t.
    align_buffer_64(row16, src_width * 2);
    void (*ScaleAddCols)(int dst_width, int boxheight, int x, int dx,
                         const uint16_t* src_ptr, uint8_t* dst_ptr) =
        (dx & 0xffff) ? ScaleAddCols2_C
                      : ((dx != 0x10000) ? ScaleAddCols1_C : ScaleAddCols0_C);
    void (*ScaleAddRow)(const uint8_t* src_ptr, uint16_t* dst_ptr,
                        int src_width) = ScaleAddRow_C;
#if defined(HAS_SCALEADDROW_SSE2)
    if (TestCpuFlag(kCpuHasSSE2)) {
      ScaleAddRow = ScaleAddRow_Any_SSE2;
      if (IS_ALIGNED(src_width, 16)) {
        ScaleAddRow = ScaleAddRow_SSE2;
      }
    }
#endif
#if defined(HAS_SCALEADDROW_AVX2)
    if (TestCpuFlag(kCpuHasAVX2)) {
      ScaleAddRow = ScaleAddRow_Any_AVX2;
      if (IS_ALIGNED(src_width, 32)) {
        ScaleAddRow = ScaleAddRow_AVX2;
      }
    }
#endif
#if defined(HAS_SCALEADDROW_NEON)
    if (TestCpuFlag(kCpuHasNEON)) {
      ScaleAddRow = ScaleAddRow_Any_NEON;
      if (IS_ALIGNED(src_width, 16)) {
        ScaleAddRow = ScaleAddRow_NEON;
      }
    }
#endif
#if defined(HAS_SCALEADDROW_MMI)
    if (TestCpuFlag(kCpuHasMMI)) {
      ScaleAddRow = ScaleAddRow_Any_MMI;
      if (IS_ALIGNED(src_width, 8)) {
        ScaleAddRow = ScaleAddRow_MMI;
      }
    }
#endif
#if defined(HAS_SCALEADDROW_MSA)
    if (TestCpuFlag(kCpuHasMSA)) {
      ScaleAddRow = ScaleAddRow_Any_MSA;
      if (IS_ALIGNED(src_width, 16)) {
        ScaleAddRow = ScaleAddRow_MSA;
      }
    }
#endif

    for (j = 0; j < dst_height; ++j) {
      int boxheight;
      int iy = y >> 16;
      const uint8_t* src = src_ptr + iy * src_stride;
      y += dy;
      if (y > max_y) {
        y = max_y;
      }
      boxheight = MIN1((y >> 16) - iy);
      memset(row16, 0, src_width * 2);
      for (k = 0; k < boxheight; ++k) {
        ScaleAddRow(src, (uint16_t*)(row16), src_width);
        src += src_stride;
      }
      ScaleAddCols(dst_width, boxheight, x, dx, (uint16_t*)(row16), dst_ptr);
      dst_ptr += dst_stride;
    }
    free_aligned_buffer_64(row16);
  }
}